

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readTotalMultiplicity.hpp
# Opt level: O3

optional<njoy::ENDFtk::section::Type<12>::TotalMultiplicity> * __thiscall
njoy::ENDFtk::section::Type<12>::Multiplicities::
readTotalMultiplicity<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (optional<njoy::ENDFtk::section::Type<12>::TotalMultiplicity> *__return_storage_ptr__,
          Multiplicities *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int size)

{
  TotalMultiplicity local_a8;
  
  if (MT == 1) {
    (__return_storage_ptr__->
    super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>).
    _M_payload.
    super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>.
    super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>._M_engaged =
         false;
  }
  else {
    TotalMultiplicity::TotalMultiplicity<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&local_a8,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
    *(_Head_base<5UL,_long,_false> *)
     &(__return_storage_ptr__->
      super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>).
      _M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
      .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>._M_payload.
      _M_value.super_TabulationRecord.super_InterpolationBase =
         local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
         super__Head_base<5UL,_long,_false>._M_head_impl;
    ((_Head_base<4UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>).
            _M_payload.
            super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
            .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>.
            _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 8))->_M_head_impl =
         local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
    ((_Head_base<3UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>).
            _M_payload.
            super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
            .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>.
            _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x10))->
    _M_head_impl = local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                   _M_head_impl;
    ((_Head_base<2UL,_long,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>).
            _M_payload.
            super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
            .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>.
            _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x18))->
    _M_head_impl = local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>
                   ._M_head_impl;
    ((_Head_base<1UL,_double,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>).
            _M_payload.
            super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
            .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>.
            _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x20))->
    _M_head_impl = local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Head_base<1UL,_double,_false>._M_head_impl;
    ((_Head_base<0UL,_double,_false> *)
    ((long)&(__return_storage_ptr__->
            super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>).
            _M_payload.
            super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
            .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>.
            _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x28))->
    _M_head_impl = local_a8.super_TabulationRecord.super_InterpolationBase.metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Head_base<0UL,_double,_false>._M_head_impl;
    *(pointer *)
     &(((vector<long,_std::allocator<long>_> *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>
               )._M_payload.
               super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
               .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>.
               _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x30))->
      super__Vector_base<long,_std::allocator<long>_>)._M_impl =
         local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>)
             ._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>.
             _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x38) =
         local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>)
             ._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>.
             _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x40) =
         local_a8.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    *(pointer *)
     &(((vector<long,_std::allocator<long>_> *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>
               )._M_payload.
               super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
               .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>.
               _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x48))->
      super__Vector_base<long,_std::allocator<long>_>)._M_impl =
         local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>)
             ._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>.
             _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x50) =
         local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>)
             ._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>.
             _M_payload._M_value.super_TabulationRecord.super_InterpolationBase + 0x58) =
         local_a8.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    *(pointer *)
     &(__return_storage_ptr__->
      super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>).
      _M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
      .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>._M_payload.
      _M_value.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl = local_a8.super_TabulationRecord.xValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>)
             ._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>.
             _M_payload._M_value.super_TabulationRecord.xValues + 8) =
         local_a8.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>)
             ._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>.
             _M_payload._M_value.super_TabulationRecord.xValues + 0x10) =
         local_a8.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(pointer *)
     &(__return_storage_ptr__->
      super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>).
      _M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
      .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>._M_payload.
      _M_value.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl = local_a8.super_TabulationRecord.yValues.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>)
             ._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>.
             _M_payload._M_value.super_TabulationRecord.yValues + 8) =
         local_a8.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>)
             ._M_payload.
             super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
             .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>.
             _M_payload._M_value.super_TabulationRecord.yValues + 0x10) =
         local_a8.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->
    super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>).
    _M_payload.
    super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>.
    super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>._M_engaged =
         true;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::optional< TotalMultiplicity >
readTotalMultiplicity( Iterator& begin,
                       const Iterator& end,
                       long& lineNumber,
                       int MAT,
                       int MF,
                       int MT,
                       int size ) {

  if ( size == 1 ) {

    return std::nullopt;
  }

  return std::make_optional( TotalMultiplicity( begin, end, lineNumber,
                                                MAT, MF, MT ) );
}